

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_chk2(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  ushort uVar1;
  uint16_t uVar2;
  int arg2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 arg3;
  TCGv_i32 arg;
  int local_5c;
  int opsize;
  TCGv_i32 reg;
  TCGv_i32 bound2;
  TCGv_i32 bound1;
  TCGv_i32 addr2;
  TCGv_i32 addr1;
  uint16_t ext;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = insn >> 9 & 3;
  if ((insn >> 9 & 3) == 0) {
    local_5c = 0;
  }
  else if (uVar1 == 1) {
    local_5c = 1;
  }
  else {
    if (uVar1 != 2) {
      gen_exception(s,(s->base).pc_next,4);
      return;
    }
    local_5c = 2;
  }
  uVar2 = read_im16(env,s);
  if ((uVar2 & 0x800) == 0) {
    gen_exception(s,(s->base).pc_next,4);
  }
  else {
    pTVar3 = gen_lea(env,s,insn,7);
    pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
    arg2 = opsize_bytes(local_5c);
    tcg_gen_addi_i32_m68k(tcg_ctx_00,pTVar4,pTVar3,arg2);
    arg3 = gen_load(s,local_5c,pTVar3,1,(uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1))
    ;
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    pTVar3 = gen_load(s,local_5c,pTVar4,1,
                      (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    tcg_temp_free_i32(tcg_ctx_00,pTVar4);
    pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
    if ((uVar2 & 0x8000) == 0) {
      gen_ext(tcg_ctx_00,pTVar4,tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar2 >> 0xc & 7)],local_5c,1
             );
    }
    else {
      arg = get_areg(s,(int)(uint)uVar2 >> 0xc & 7);
      tcg_gen_mov_i32(tcg_ctx_00,pTVar4,arg);
    }
    gen_flush_flags(s);
    gen_helper_chk2(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar4,arg3,pTVar3);
    tcg_temp_free_i32(tcg_ctx_00,pTVar4);
    tcg_temp_free_i32(tcg_ctx_00,arg3);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
  }
  return;
}

Assistant:

DISAS_INSN(chk2)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext;
    TCGv addr1, addr2, bound1, bound2, reg;
    int opsize;

    switch ((insn >> 9) & 3) {
    case 0:
        opsize = OS_BYTE;
        break;
    case 1:
        opsize = OS_WORD;
        break;
    case 2:
        opsize = OS_LONG;
        break;
    default:
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
        return;
    }

    ext = read_im16(env, s);
    if ((ext & 0x0800) == 0) {
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
        return;
    }

    addr1 = gen_lea(env, s, insn, OS_UNSIZED);
    addr2 = tcg_temp_new(tcg_ctx);
    tcg_gen_addi_i32(tcg_ctx, addr2, addr1, opsize_bytes(opsize));

    bound1 = gen_load(s, opsize, addr1, 1, IS_USER(s));
    tcg_temp_free(tcg_ctx, addr1);
    bound2 = gen_load(s, opsize, addr2, 1, IS_USER(s));
    tcg_temp_free(tcg_ctx, addr2);

    reg = tcg_temp_new(tcg_ctx);
    if (ext & 0x8000) {
        tcg_gen_mov_i32(tcg_ctx, reg, AREG(ext, 12));
    } else {
        gen_ext(tcg_ctx, reg, DREG(ext, 12), opsize, 1);
    }

    gen_flush_flags(s);
    gen_helper_chk2(tcg_ctx, tcg_ctx->cpu_env, reg, bound1, bound2);
    tcg_temp_free(tcg_ctx, reg);
    tcg_temp_free(tcg_ctx, bound1);
    tcg_temp_free(tcg_ctx, bound2);
}